

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O2

int __thiscall glslang::TPpContext::scanToken(TPpContext *this,TPpToken *ppToken)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pTVar4;
  bool bVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  pointer pptVar10;
  pointer pptVar11;
  int iVar12;
  long lVar13;
  int *piVar14;
  bool bVar15;
  int local_2c;
  
  while( true ) {
    pptVar11 = (this->inputStack).
               super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pptVar10 = (this->inputStack).
               super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    iVar8 = -1;
    if (pptVar11 == pptVar10) break;
    iVar8 = (*pptVar10[-1]->_vptr_tInput[2])(pptVar10[-1],ppToken);
    pptVar11 = (this->inputStack).
               super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pptVar10 = (this->inputStack).
               super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if ((iVar8 != -1) || (iVar8 = -1, pptVar11 == pptVar10)) break;
    popInput(this);
  }
  if ((pptVar11 != pptVar10) &&
     ((local_2c = iVar8, iVar9 = (*pptVar10[-1]->_vptr_tInput[9])(), (char)iVar9 != '\0' &&
      (this->inElseSkip == false)))) {
    if (iVar8 == 10) {
      bVar6 = 0;
      iVar8 = 0;
      do {
        piVar2 = (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar14 = piVar2 + iVar8;
        lVar7 = (long)iVar8 * 0x18 + -0x18;
        do {
          iVar9 = iVar8;
          lVar13 = lVar7;
          if ((int)((ulong)((long)piVar3 - (long)piVar2) >> 2) + -1 <= iVar9) {
            if (piVar3 != piVar2) {
              (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = piVar2;
            }
            pTVar4 = (this->lastLineTokenLocs).
                     super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((this->lastLineTokenLocs).
                super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>.
                _M_impl.super__Vector_impl_data._M_finish == pTVar4) {
              return 10;
            }
            (this->lastLineTokenLocs).
            super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>._M_impl.
            super__Vector_impl_data._M_finish = pTVar4;
            return 10;
          }
          iVar12 = iVar9 + 1;
          iVar1 = *piVar14;
          piVar14 = piVar14 + 1;
          lVar7 = lVar13 + 0x18;
          iVar8 = iVar12;
        } while (iVar1 != 0x23);
        bVar15 = piVar2[iVar12] != 0x23;
        iVar8 = iVar9 + 2;
        if (bVar15) {
          iVar8 = iVar12;
        }
        bVar5 = (bool)(bVar15 & bVar6);
        bVar6 = bVar6 | bVar15;
        if (bVar5) {
          (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                    (this->parseContext,
                     (long)&(this->lastLineTokenLocs).
                            super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].name + lVar13,
                     "(#) can be preceded in its line only by spaces or horizontal tabs","#","");
          bVar6 = 1;
        }
      } while( true );
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->lastLineTokens,&local_2c);
    std::vector<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>::push_back
              (&this->lastLineTokenLocs,&ppToken->loc);
    iVar8 = local_2c;
  }
  return iVar8;
}

Assistant:

int scanToken(TPpToken* ppToken)
    {
        int token = EndOfInput;

        while (! inputStack.empty()) {
            token = inputStack.back()->scan(ppToken);
            if (token != EndOfInput || inputStack.empty())
                break;
            popInput();
        }
        if (!inputStack.empty() && inputStack.back()->isStringInput() && !inElseSkip) {
            if (token == '\n') {
                bool seenNumSign = false;
                for (int i = 0; i < (int)lastLineTokens.size() - 1;) {
                    int curPos = i;
                    int curToken = lastLineTokens[i++];
                    if (curToken == '#' && lastLineTokens[i] == '#') {
                        curToken = PpAtomPaste;
                        i++;
                    }
                    if (curToken == '#') {
                        if (seenNumSign) {
                            parseContext.ppError(lastLineTokenLocs[curPos], "(#) can be preceded in its line only by spaces or horizontal tabs", "#", "");
                        } else {
                            seenNumSign = true;
                        }
                    }
                }
                lastLineTokens.clear();
                lastLineTokenLocs.clear();
            } else {
                lastLineTokens.push_back(token);
                lastLineTokenLocs.push_back(ppToken->loc);
            }
        }
        return token;
    }